

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi.c
# Opt level: O2

opj_bool pi_create_encode(opj_pi_iterator_t *pi,opj_cp_t *cp,int tileno,int pino,int tpnum,int tppos
                         ,J2K_T2_MODE t2_mode,int cur_totnum_tp)

{
  undefined4 uVar1;
  undefined4 uVar2;
  char cVar3;
  OPJ_PROG_ORDER OVar4;
  int iVar5;
  opj_tcp_t *poVar6;
  bool bVar7;
  OPJ_UINT32 OVar8;
  OPJ_UINT32 OVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  char local_34 [4];
  char prog [4];
  
  poVar6 = cp->tcps;
  pi[pino].first = 1;
  OVar4 = poVar6[tileno].pocs[pino].prg;
  pi[pino].poc.prg = OVar4;
  switch(OVar4) {
  case LRCP:
    builtin_strncpy(local_34,"LRCP",4);
    break;
  case RLCP:
    builtin_strncpy(local_34,"RLCP",4);
    break;
  case RPCL:
    builtin_strncpy(local_34,"RPCL",4);
    break;
  case PCRL:
    builtin_strncpy(local_34,"PCRL",4);
    break;
  case CPRL:
    builtin_strncpy(local_34,"CPRL",4);
    break;
  case PROG_UNKNOWN:
    return 1;
  }
  if ((cp->tp_on == '\0') || ((t2_mode != FINAL_PASS && (cp->cinema == OFF)))) {
    OVar9 = poVar6[tileno].pocs[pino].resS;
    OVar8 = poVar6[tileno].pocs[pino].compS;
    pi[pino].poc.compno1 = poVar6[tileno].pocs[pino].compE;
    pi[pino].poc.layno0 = poVar6[tileno].pocs[pino].layS;
    uVar1 = poVar6[tileno].pocs[pino].layE;
    uVar2 = poVar6[tileno].pocs[pino].resE;
    pi[pino].poc.resno0 = OVar9;
    pi[pino].poc.compno0 = OVar8;
    pi[pino].poc.layno1 = uVar1;
    pi[pino].poc.resno1 = uVar2;
    pi[pino].poc.precno0 = poVar6[tileno].pocs[pino].prcS;
    pi[pino].poc.precno1 = poVar6[tileno].pocs[pino].prcE;
    iVar10 = poVar6[tileno].pocs[pino].txE;
    iVar5 = poVar6[tileno].pocs[pino].tyS;
    iVar12 = poVar6[tileno].pocs[pino].tyE;
    pi[pino].poc.tx0 = poVar6[tileno].pocs[pino].txS;
    pi[pino].poc.tx1 = iVar10;
    pi[pino].poc.ty0 = iVar5;
    pi[pino].poc.ty1 = iVar12;
  }
  else if (tpnum < cur_totnum_tp) {
    bVar7 = true;
    for (uVar11 = 3; -1 < (int)uVar11; uVar11 = uVar11 - 1) {
      cVar3 = local_34[uVar11];
      if (cVar3 == 'R') {
        if (tppos < (int)uVar11) {
          pi[pino].poc.resno0 = poVar6[tileno].pocs[pino].resS;
          pi[pino].poc.resno1 = poVar6[tileno].pocs[pino].resE;
        }
        else if (tpnum == 0) {
          OVar9 = poVar6[tileno].pocs[pino].resS;
          pi[pino].poc.resno0 = OVar9;
          OVar9 = OVar9 + 1;
          pi[pino].poc.resno1 = OVar9;
          poVar6[tileno].pocs[pino].res_t = OVar9;
        }
        else {
          OVar9 = poVar6[tileno].pocs[pino].res_t;
          if (bVar7) {
            if (OVar9 == poVar6[tileno].pocs[pino].resE) {
              OVar9 = poVar6[tileno].pocs[pino].resS;
              pi[pino].poc.resno0 = OVar9;
              OVar9 = OVar9 + 1;
              pi[pino].poc.resno1 = OVar9;
              poVar6[tileno].pocs[pino].res_t = OVar9;
LAB_001eaf3c:
              bVar7 = true;
              goto LAB_001eb0e0;
            }
            pi[pino].poc.resno0 = OVar9;
            pi[pino].poc.resno1 = OVar9 + 1;
            poVar6[tileno].pocs[pino].res_t = OVar9 + 1;
          }
          else {
            pi[pino].poc.resno0 = OVar9 - 1;
            pi[pino].poc.resno1 = OVar9;
          }
LAB_001eb0dd:
          bVar7 = false;
        }
      }
      else if (cVar3 == 'L') {
        if (tppos < (int)uVar11) {
          pi[pino].poc.layno0 = poVar6[tileno].pocs[pino].layS;
          pi[pino].poc.layno1 = poVar6[tileno].pocs[pino].layE;
        }
        else {
          if (tpnum != 0) {
            OVar9 = poVar6[tileno].pocs[pino].lay_t;
            if (bVar7) {
              if (OVar9 == poVar6[tileno].pocs[pino].layE) {
                iVar10 = poVar6[tileno].pocs[pino].layS;
                pi[pino].poc.layno0 = iVar10;
                OVar9 = iVar10 + 1;
                pi[pino].poc.layno1 = OVar9;
                poVar6[tileno].pocs[pino].lay_t = OVar9;
                goto LAB_001eaf3c;
              }
              pi[pino].poc.layno0 = OVar9;
              pi[pino].poc.layno1 = OVar9 + 1;
              poVar6[tileno].pocs[pino].lay_t = OVar9 + 1;
            }
            else {
              pi[pino].poc.layno0 = OVar9 - 1;
              pi[pino].poc.layno1 = OVar9;
            }
            goto LAB_001eb0dd;
          }
          iVar10 = poVar6[tileno].pocs[pino].layS;
          pi[pino].poc.layno0 = iVar10;
          OVar9 = iVar10 + 1;
          pi[pino].poc.layno1 = OVar9;
          poVar6[tileno].pocs[pino].lay_t = OVar9;
        }
      }
      else if (cVar3 == 'P') {
        if ((uint)OVar4 < 2) {
          if (tppos < (int)uVar11) {
            pi[pino].poc.precno0 = poVar6[tileno].pocs[pino].prcS;
            pi[pino].poc.precno1 = poVar6[tileno].pocs[pino].prcE;
          }
          else {
            if (tpnum != 0) {
              iVar10 = poVar6[tileno].pocs[pino].prc_t;
              if (bVar7) {
                if (iVar10 == poVar6[tileno].pocs[pino].prcE) {
                  iVar10 = poVar6[tileno].pocs[pino].prcS;
                  pi[pino].poc.precno0 = iVar10;
                  iVar10 = iVar10 + 1;
                  pi[pino].poc.precno1 = iVar10;
                  poVar6[tileno].pocs[pino].prc_t = iVar10;
                  goto LAB_001eaf3c;
                }
                pi[pino].poc.precno0 = iVar10;
                pi[pino].poc.precno1 = iVar10 + 1;
                poVar6[tileno].pocs[pino].prc_t = iVar10 + 1;
              }
              else {
                pi[pino].poc.precno0 = iVar10 + -1;
                pi[pino].poc.precno1 = iVar10;
              }
              goto LAB_001eb0dd;
            }
            iVar10 = poVar6[tileno].pocs[pino].prcS;
            pi[pino].poc.precno0 = iVar10;
            iVar10 = iVar10 + 1;
            pi[pino].poc.precno1 = iVar10;
            poVar6[tileno].pocs[pino].prc_t = iVar10;
          }
        }
        else if (tppos < (int)uVar11) {
          iVar10 = poVar6[tileno].pocs[pino].txE;
          iVar5 = poVar6[tileno].pocs[pino].tyS;
          iVar12 = poVar6[tileno].pocs[pino].tyE;
          pi[pino].poc.tx0 = poVar6[tileno].pocs[pino].txS;
          pi[pino].poc.tx1 = iVar10;
          pi[pino].poc.ty0 = iVar5;
          pi[pino].poc.ty1 = iVar12;
        }
        else {
          if (tpnum != 0) {
            iVar10 = poVar6[tileno].pocs[pino].tx0_t;
            if (bVar7) {
              if (poVar6[tileno].pocs[pino].txE <= iVar10) {
                iVar10 = poVar6[tileno].pocs[pino].ty0_t;
                bVar7 = poVar6[tileno].pocs[pino].tyE <= iVar10;
                if (bVar7) {
                  iVar10 = poVar6[tileno].pocs[pino].tyS;
                }
                pi[pino].poc.ty0 = iVar10;
                iVar5 = poVar6[tileno].pocs[pino].dy;
                iVar10 = (iVar5 + iVar10) - iVar10 % iVar5;
                pi[pino].poc.ty1 = iVar10;
                poVar6[tileno].pocs[pino].ty0_t = iVar10;
                iVar10 = poVar6[tileno].pocs[pino].txS;
                pi[pino].poc.tx0 = iVar10;
                iVar5 = poVar6[tileno].pocs[pino].dx;
                iVar10 = (iVar5 + iVar10) - iVar10 % iVar5;
                pi[pino].poc.tx1 = iVar10;
                poVar6[tileno].pocs[pino].tx0_t = iVar10;
                goto LAB_001eb0e0;
              }
              pi[pino].poc.tx0 = iVar10;
              iVar5 = poVar6[tileno].pocs[pino].dx;
              iVar10 = (iVar5 + iVar10) - iVar10 % iVar5;
              pi[pino].poc.tx1 = iVar10;
              poVar6[tileno].pocs[pino].tx0_t = iVar10;
            }
            else {
              iVar5 = poVar6[tileno].pocs[pino].dx;
              pi[pino].poc.tx0 = iVar10 - (iVar10 % iVar5 + iVar5);
              pi[pino].poc.tx1 = iVar10;
            }
            iVar10 = poVar6[tileno].pocs[pino].dy;
            iVar5 = poVar6[tileno].pocs[pino].ty0_t;
            pi[pino].poc.ty0 = iVar5 - (iVar5 % iVar10 + iVar10);
            pi[pino].poc.ty1 = iVar5;
            goto LAB_001eb0dd;
          }
          iVar10 = poVar6[tileno].pocs[pino].txS;
          iVar5 = poVar6[tileno].pocs[pino].tyS;
          pi[pino].poc.tx0 = iVar10;
          iVar12 = poVar6[tileno].pocs[pino].dx;
          iVar12 = (iVar12 + iVar10) - iVar10 % iVar12;
          pi[pino].poc.tx1 = iVar12;
          pi[pino].poc.ty0 = iVar5;
          iVar10 = poVar6[tileno].pocs[pino].dy;
          iVar10 = (iVar10 + iVar5) - iVar5 % iVar10;
          pi[pino].poc.ty1 = iVar10;
          poVar6[tileno].pocs[pino].tx0_t = iVar12;
          poVar6[tileno].pocs[pino].ty0_t = iVar10;
        }
      }
      else if (cVar3 == 'C') {
        if (tppos < (int)uVar11) {
          pi[pino].poc.compno0 = poVar6[tileno].pocs[pino].compS;
          pi[pino].poc.compno1 = poVar6[tileno].pocs[pino].compE;
        }
        else {
          if (tpnum != 0) {
            OVar9 = poVar6[tileno].pocs[pino].comp_t;
            if (bVar7) {
              if (OVar9 == poVar6[tileno].pocs[pino].compE) {
                OVar9 = poVar6[tileno].pocs[pino].compS;
                pi[pino].poc.compno0 = OVar9;
                OVar9 = OVar9 + 1;
                pi[pino].poc.compno1 = OVar9;
                poVar6[tileno].pocs[pino].comp_t = OVar9;
                goto LAB_001eaf3c;
              }
              pi[pino].poc.compno0 = OVar9;
              pi[pino].poc.compno1 = OVar9 + 1;
              poVar6[tileno].pocs[pino].comp_t = OVar9 + 1;
            }
            else {
              pi[pino].poc.compno0 = OVar9 - 1;
              pi[pino].poc.compno1 = OVar9;
            }
            goto LAB_001eb0dd;
          }
          OVar9 = poVar6[tileno].pocs[pino].compS;
          pi[pino].poc.compno0 = OVar9;
          OVar9 = OVar9 + 1;
          pi[pino].poc.compno1 = OVar9;
          poVar6[tileno].pocs[pino].comp_t = OVar9;
        }
      }
LAB_001eb0e0:
    }
  }
  return 0;
}

Assistant:

opj_bool pi_create_encode( opj_pi_iterator_t *pi, opj_cp_t *cp,int tileno, int pino,int tpnum, int tppos, J2K_T2_MODE t2_mode,int cur_totnum_tp){
	char prog[4];
	int i;
	int incr_top=1,resetX=0;
	opj_tcp_t *tcps =&cp->tcps[tileno];
	opj_poc_t *tcp= &tcps->pocs[pino];

	pi[pino].first = 1;
	pi[pino].poc.prg = tcp->prg;

	switch(tcp->prg){
		case CPRL: strncpy(prog, "CPRL",4);
			break;
		case LRCP: strncpy(prog, "LRCP",4);
			break;
		case PCRL: strncpy(prog, "PCRL",4);
			break;
		case RLCP: strncpy(prog, "RLCP",4);
			break;
		case RPCL: strncpy(prog, "RPCL",4);
			break;
		case PROG_UNKNOWN: 
			return OPJ_TRUE;
	}

	if(!(cp->tp_on && ((!cp->cinema && (t2_mode == FINAL_PASS)) || cp->cinema))){
		pi[pino].poc.resno0 = tcp->resS;
		pi[pino].poc.resno1 = tcp->resE;
		pi[pino].poc.compno0 = tcp->compS;
		pi[pino].poc.compno1 = tcp->compE;
		pi[pino].poc.layno0 = tcp->layS;
		pi[pino].poc.layno1 = tcp->layE;
		pi[pino].poc.precno0 = tcp->prcS;
		pi[pino].poc.precno1 = tcp->prcE;
		pi[pino].poc.tx0 = tcp->txS;
		pi[pino].poc.ty0 = tcp->tyS;
		pi[pino].poc.tx1 = tcp->txE;
		pi[pino].poc.ty1 = tcp->tyE;
	}else {
		if( tpnum < cur_totnum_tp){
			for(i=3;i>=0;i--){
				switch(prog[i]){
				case 'C':
					if (i > tppos){
						pi[pino].poc.compno0 = tcp->compS;
						pi[pino].poc.compno1 = tcp->compE;
					}else{
						if (tpnum == 0){
							tcp->comp_t = tcp->compS;
							pi[pino].poc.compno0 = tcp->comp_t;
							pi[pino].poc.compno1 = tcp->comp_t+1;
							tcp->comp_t+=1;
						}else{
							if (incr_top == 1){
								if(tcp->comp_t ==tcp->compE){
									tcp->comp_t = tcp->compS;
									pi[pino].poc.compno0 = tcp->comp_t;
									pi[pino].poc.compno1 = tcp->comp_t+1;
									tcp->comp_t+=1;
									incr_top=1;
								}else{
									pi[pino].poc.compno0 = tcp->comp_t;
									pi[pino].poc.compno1 = tcp->comp_t+1;
									tcp->comp_t+=1;
									incr_top=0;
								}
							}else{
								pi[pino].poc.compno0 = tcp->comp_t-1;
								pi[pino].poc.compno1 = tcp->comp_t;
							}
						}
					}
					break;

				case 'R':
					if (i > tppos){
						pi[pino].poc.resno0 = tcp->resS;
						pi[pino].poc.resno1 = tcp->resE;
					}else{
						if (tpnum == 0){
							tcp->res_t = tcp->resS;
							pi[pino].poc.resno0 = tcp->res_t;
							pi[pino].poc.resno1 = tcp->res_t+1;
							tcp->res_t+=1;
						}else{
							if (incr_top == 1){
								if(tcp->res_t==tcp->resE){
									tcp->res_t = tcp->resS;
									pi[pino].poc.resno0 = tcp->res_t;
									pi[pino].poc.resno1 = tcp->res_t+1;
									tcp->res_t+=1;
									incr_top=1;
								}else{
									pi[pino].poc.resno0 = tcp->res_t;
									pi[pino].poc.resno1 = tcp->res_t+1;
									tcp->res_t+=1;
									incr_top=0;
								}
							}else{
								pi[pino].poc.resno0 = tcp->res_t - 1;
								pi[pino].poc.resno1 = tcp->res_t;
							}
						}
					}
					break;

				case 'L':
					if (i > tppos){
						pi[pino].poc.layno0 = tcp->layS;
						pi[pino].poc.layno1 = tcp->layE;
					}else{
						if (tpnum == 0){
							tcp->lay_t = tcp->layS;
							pi[pino].poc.layno0 = tcp->lay_t;
							pi[pino].poc.layno1 = tcp->lay_t+1;
							tcp->lay_t+=1;
						}else{
							if (incr_top == 1){
								if(tcp->lay_t == tcp->layE){
									tcp->lay_t = tcp->layS;
									pi[pino].poc.layno0 = tcp->lay_t;
									pi[pino].poc.layno1 = tcp->lay_t+1;
									tcp->lay_t+=1;
									incr_top=1;
								}else{
									pi[pino].poc.layno0 = tcp->lay_t;
									pi[pino].poc.layno1 = tcp->lay_t+1;
									tcp->lay_t+=1;
									incr_top=0;
								}
							}else{
								pi[pino].poc.layno0 = tcp->lay_t - 1;
								pi[pino].poc.layno1 = tcp->lay_t;
							}
						}
					}
					break;

				case 'P':
					switch(tcp->prg){
						case LRCP:
						case RLCP:
							if (i > tppos){
								pi[pino].poc.precno0 = tcp->prcS;
								pi[pino].poc.precno1 = tcp->prcE;
							}else{
								if (tpnum == 0){
									tcp->prc_t = tcp->prcS;
									pi[pino].poc.precno0 = tcp->prc_t;
									pi[pino].poc.precno1 = tcp->prc_t+1;
									tcp->prc_t+=1; 
								}else{
									if (incr_top == 1){
										if(tcp->prc_t == tcp->prcE){
											tcp->prc_t = tcp->prcS;
											pi[pino].poc.precno0 = tcp->prc_t;
											pi[pino].poc.precno1 = tcp->prc_t+1;
											tcp->prc_t+=1;
											incr_top=1;
										}else{
											pi[pino].poc.precno0 = tcp->prc_t;
											pi[pino].poc.precno1 = tcp->prc_t+1;
											tcp->prc_t+=1;
											incr_top=0;
										}
									}else{
										pi[pino].poc.precno0 = tcp->prc_t - 1;
										pi[pino].poc.precno1 = tcp->prc_t;
									}
								}
							}
						break;
						default:
							if (i > tppos){
								pi[pino].poc.tx0 = tcp->txS;
								pi[pino].poc.ty0 = tcp->tyS;
								pi[pino].poc.tx1 = tcp->txE;
								pi[pino].poc.ty1 = tcp->tyE;
							}else{
								if (tpnum == 0){
									tcp->tx0_t = tcp->txS;
									tcp->ty0_t = tcp->tyS;
									pi[pino].poc.tx0 = tcp->tx0_t;
									pi[pino].poc.tx1 = tcp->tx0_t + tcp->dx - (tcp->tx0_t % tcp->dx);
									pi[pino].poc.ty0 = tcp->ty0_t;
									pi[pino].poc.ty1 = tcp->ty0_t + tcp->dy - (tcp->ty0_t % tcp->dy);
									tcp->tx0_t = pi[pino].poc.tx1;
									tcp->ty0_t = pi[pino].poc.ty1;
								}else{
									if (incr_top == 1){
										if(tcp->tx0_t >= tcp->txE){
											if(tcp->ty0_t >= tcp->tyE){
												tcp->ty0_t = tcp->tyS;
												pi[pino].poc.ty0 = tcp->ty0_t;
												pi[pino].poc.ty1 = tcp->ty0_t + tcp->dy - (tcp->ty0_t % tcp->dy);
												tcp->ty0_t = pi[pino].poc.ty1;
												incr_top=1;resetX=1;
											}else{
												pi[pino].poc.ty0 = tcp->ty0_t;
												pi[pino].poc.ty1 = tcp->ty0_t + tcp->dy - (tcp->ty0_t % tcp->dy);
												tcp->ty0_t = pi[pino].poc.ty1;
												incr_top=0;resetX=1;
											}
											if(resetX==1){
												tcp->tx0_t = tcp->txS;
												pi[pino].poc.tx0 = tcp->tx0_t;
												pi[pino].poc.tx1 = tcp->tx0_t + tcp->dx- (tcp->tx0_t % tcp->dx);
												tcp->tx0_t = pi[pino].poc.tx1;
											}
										}else{
											pi[pino].poc.tx0 = tcp->tx0_t;
											pi[pino].poc.tx1 = tcp->tx0_t + tcp->dx- (tcp->tx0_t % tcp->dx);
											tcp->tx0_t = pi[pino].poc.tx1;
											pi[pino].poc.ty0 = tcp->ty0_t - tcp->dy - (tcp->ty0_t % tcp->dy);
											pi[pino].poc.ty1 = tcp->ty0_t ;
											incr_top=0;
										}
									}else{
										pi[pino].poc.tx0 = tcp->tx0_t - tcp->dx - (tcp->tx0_t % tcp->dx);
										pi[pino].poc.tx1 = tcp->tx0_t ;
										pi[pino].poc.ty0 = tcp->ty0_t - tcp->dy - (tcp->ty0_t % tcp->dy);
										pi[pino].poc.ty1 = tcp->ty0_t ;
									}
								}
							}
						break;
						}
						break;
				}		
			} 
		}
	}	
	return OPJ_FALSE;
}